

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

void __thiscall grib2dec_demo::Output::Output(Output *this,string *filename)

{
  bool bVar1;
  ulong uVar2;
  ostream *local_40;
  string *filename_local;
  Output *this_local;
  
  this->_vptr_Output = (_func_int **)&PTR___cxa_pure_virtual_00108c80;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) || (bVar1 = std::operator==(filename,"-"), bVar1)) {
    local_40 = (ostream *)&std::cout;
  }
  else {
    local_40 = (ostream *)&this->fileOut;
  }
  this->out = local_40;
  std::ofstream::ofstream(&this->fileOut);
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (bVar1 = std::operator!=(filename,"-"), bVar1)) {
    std::ofstream::open(&this->fileOut,filename,0x10);
  }
  return;
}

Assistant:

Output::Output(const string& filename)
    : out(filename.empty() || filename == "-" ? cout : fileOut)
{
    if (!filename.empty() && filename != "-")
        fileOut.open(filename);
}